

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Superposition.cpp
# Opt level: O1

Clause * __thiscall
Inferences::Superposition::performSuperposition
          (Superposition *this,Clause *rwClause,Literal *rwLit,TermList rwTerm,Clause *eqClause,
          Literal *eqLit,TermList eqLHS,AbstractingUnifier *unifier,bool eqIsResult)

{
  long *plVar1;
  PassiveClauseContainer *passiveClauseContainer;
  PartialRedundancyHandler *pPVar2;
  Ordering *this_00;
  _Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false> _Var3;
  uint numPositiveLiteralsLowerBound;
  bool bVar4;
  Self SVar5;
  bool bVar6;
  char cVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  Result RVar11;
  void **head;
  TermList TVar12;
  Literal *pLVar13;
  TermList trm;
  Literal *pLVar14;
  TermList arg1_00;
  Literal *pLVar15;
  ulong uVar16;
  undefined8 uVar17;
  AnswerLiteralManager *pAVar18;
  undefined4 extraout_var;
  Clause *pCVar19;
  InferenceExtra *extra;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar20;
  Clause *pCVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  RefIterator it;
  bool andThatsIt;
  Clause *local_188;
  Clause *local_180;
  undefined4 local_174;
  TermList local_170;
  ulong local_168;
  ResultSubstitutionSP subst;
  uint local_120;
  Literal *local_118;
  Destroyer inf_destroyer;
  Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> res;
  ResultSubstitutionSP local_d8;
  Literal *local_c8;
  TermList arg1;
  Inference inf;
  Inference local_68;
  
  local_180 = rwClause;
  Indexing::ResultSubstitution::fromSubstitution
            ((ResultSubstitution *)&subst,
             (RobSubstitution *)
             (unifier->_subs)._self._M_t.
             super___uniq_ptr_impl<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>
             ._M_t.
             super__Tuple_impl<0UL,_Kernel::RobSubstitution_*,_std::default_delete<Kernel::RobSubstitution>_>
             .super__Head_base<0UL,_Kernel::RobSubstitution_*,_false>,0,1);
  local_170 = Kernel::SortHelper::getEqualityArgumentSort(eqLit);
  if ((((eqLHS._content & 1) != 0) &&
      (bVar6 = checkSuperpositionFromVariable(eqClause,eqLit,eqLHS), !bVar6)) ||
     (bVar6 = checkClauseColorCompatibility(this,eqClause,local_180), !bVar6)) {
    pCVar19 = (Clause *)0x0;
    goto LAB_005218bb;
  }
  local_168 = *(ulong *)&local_180->field_0x38;
  uVar24 = *(ulong *)&eqClause->field_0x38;
  TVar12 = Kernel::EqHelper::getOtherEqualitySide(eqLit,eqLHS);
  local_188 = eqClause;
  uVar8 = Kernel::Clause::numPositiveLiterals(eqClause);
  pCVar19 = local_180;
  uVar9 = Kernel::Clause::numPositiveLiterals(local_180);
  numPositiveLiteralsLowerBound = uVar8 - 1;
  if ((int)(uVar8 - 1) <= (int)uVar9) {
    numPositiveLiteralsLowerBound = uVar9;
  }
  res._self._M_t.
  super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
  .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
       (__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
        )(CONCAT71(res._self._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl._1_7_
                   ,((unifier->_uwa)._mode != OFF) * '\x02') | 0x3c);
  res._8_8_ = pCVar19;
  Kernel::Inference::Inference(&inf,(GeneratingInference2 *)&res);
  passiveClauseContainer =
       (((this->super_GeneratingInferenceEngine).super_SimplifyingGeneratingInference.
         super_InferenceEngine._salg)->_passive)._M_t.
       super___uniq_ptr_impl<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
       ._M_t.
       super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
       .super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>._M_head_impl;
  andThatsIt = false;
  inf_destroyer._destroyee = &inf;
  if ((passiveClauseContainer == (PassiveClauseContainer *)0x0) ||
     (cVar7 = (**(code **)(*(long *)&(passiveClauseContainer->super_RandomAccessClauseContainer).
                                     super_ClauseContainer + 0x78))(passiveClauseContainer),
     cVar7 == '\0')) {
    local_174 = 0;
  }
  else {
    local_174 = (**(code **)(*(long *)&(passiveClauseContainer->super_RandomAccessClauseContainer).
                                       super_ClauseContainer + 0x80))
                          (passiveClauseContainer,numPositiveLiteralsLowerBound,&inf,&andThatsIt);
  }
  if ((char)local_174 == '\0') {
LAB_00521180:
    pPVar2 = (((this->super_GeneratingInferenceEngine).super_SimplifyingGeneratingInference.
               super_InferenceEngine._salg)->_partialRedundancyHandler)._M_t.
             super___uniq_ptr_impl<Shell::PartialRedundancyHandler,_std::default_delete<Shell::PartialRedundancyHandler>_>
             ._M_t.
             super__Tuple_impl<0UL,_Shell::PartialRedundancyHandler_*,_std::default_delete<Shell::PartialRedundancyHandler>_>
             .super__Head_base<0UL,_Shell::PartialRedundancyHandler_*,_false>._M_head_impl;
    if (((unifier->_uwa)._mode == OFF) &&
       (iVar10 = (*pPVar2->_vptr_PartialRedundancyHandler[2])
                           (pPVar2,local_188,eqLit,local_180,rwLit,(ulong)eqIsResult,subst._obj),
       (char)iVar10 == '\0')) goto LAB_00521279;
    this_00 = (((this->super_GeneratingInferenceEngine).super_SimplifyingGeneratingInference.
                super_InferenceEngine._salg)->_ordering)._obj;
    lVar20 = 0x10;
    if (eqIsResult) {
      lVar20 = 0x28;
    }
    TVar12._content =
         (**(code **)((long)(subst._obj)->_vptr_ResultSubstitution + lVar20))
                   (subst._obj,TVar12._content);
    lVar20 = 0x30;
    if (eqIsResult) {
      lVar20 = 0x18;
    }
    pLVar13 = (Literal *)
              (**(code **)((long)(subst._obj)->_vptr_ResultSubstitution + lVar20))(subst._obj,rwLit)
    ;
    lVar20 = 0x28;
    if (eqIsResult) {
      lVar20 = 0x10;
    }
    trm._content = (**(code **)((long)(subst._obj)->_vptr_ResultSubstitution + lVar20))
                             (subst._obj,rwTerm._content);
    uVar8 = (*this_00->_vptr_Ordering[3])(this_00,TVar12._content);
    if ((uVar8 & 0xfffffffd) == 1) goto LAB_00521279;
    if ((pLVar13->super_Term)._functor == 0) {
      uVar23 = (ulong)(*(uint *)&(pLVar13->super_Term).field_0xc & 0xfffffff);
      res._self._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
           (__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
            )(pLVar13->super_Term)._args[uVar23]._content;
      arg1._content = (pLVar13->super_Term)._args[uVar23 - 1]._content;
      bVar6 = Kernel::TermList::containsSubterm((TermList *)&res,trm);
      if (bVar6) {
        bVar6 = Kernel::TermList::containsSubterm(&arg1,trm);
        if (!bVar6) {
          RVar11 = Kernel::Ordering::getEqualityArgumentOrder(this_00,pLVar13);
          if (RVar11 - EQUAL < 2) {
            if ((RVar11 & ~LESS) != GREATER) goto LAB_0052128f;
          }
          else if (RVar11 == GREATER) goto LAB_0052128f;
          goto LAB_00521279;
        }
      }
      else {
        RVar11 = Kernel::Ordering::getEqualityArgumentOrder(this_00,pLVar13);
        if ((RVar11 & ~LESS) == GREATER) goto LAB_00521279;
      }
    }
LAB_0052128f:
    if ((unifier->_uwa)._mode == OFF) {
      (*pPVar2->_vptr_PartialRedundancyHandler[3])
                (pPVar2,local_188,local_180,trm._content,TVar12._content,eqLHS._content,pLVar13,
                 eqLit,(ulong)uVar8,(ulong)eqIsResult,subst._obj);
    }
    pLVar14 = Kernel::EqHelper::replace(pLVar13,trm,TVar12);
    pCVar19 = local_188;
    if ((performSuperposition(Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::AbstractingUnifier*,bool)
         ::doSimS == '\0') &&
       (iVar10 = __cxa_guard_acquire(&performSuperposition(Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::AbstractingUnifier*,bool)
                                      ::doSimS), iVar10 != 0)) {
      iVar10 = (*(this->super_GeneratingInferenceEngine).super_SimplifyingGeneratingInference.
                 super_InferenceEngine._vptr_InferenceEngine[4])(this);
      performSuperposition::doSimS = *(bool *)(CONCAT44(extraout_var_00,iVar10) + 0x49da);
      __cxa_guard_release(&performSuperposition(Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::AbstractingUnifier*,bool)
                           ::doSimS);
      pCVar19 = local_188;
    }
    if ((((pLVar14->super_Term)._functor == 0) &&
        (((pLVar14->super_Term)._args[0]._content & 4) != 0)) &&
       (uVar23 = (ulong)(*(uint *)&(pLVar14->super_Term).field_0xc & 0xfffffff),
       (pLVar14->super_Term)._args[uVar23]._content ==
       (pLVar14->super_Term)._args[uVar23 - 1]._content)) goto LAB_00521279;
    lVar20 = 0x10;
    if (eqIsResult) {
      lVar20 = 0x28;
    }
    arg1_00._content =
         (**(code **)((long)(subst._obj)->_vptr_ResultSubstitution + lVar20))
                   (subst._obj,eqLHS._content);
    ::Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
    Recycled(&res);
    uVar23 = local_168 & 0xfffff;
    local_120 = (uint)uVar24;
    _Var3._M_head_impl =
         (unifier->_constr)._self._M_t.
         super___uniq_ptr_impl<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>
         ._M_t.
         super__Tuple_impl<0UL,_Kernel::UnificationConstraintStack_*,_std::default_delete<Kernel::UnificationConstraintStack>_>
         .super__Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false>._M_head_impl;
    ::Lib::Stack<Kernel::Literal_*>::reserve
              ((Stack<Kernel::Literal_*> *)
               res._self._M_t.
               super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
               .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,
               (ulong)(((int)((ulong)((long)((_Var3._M_head_impl)->_cont)._cursor -
                                     (long)((_Var3._M_head_impl)->_cont)._stack) >> 4) * -0x55555555
                       + ((uint)local_168 & 0xfffff) + (local_120 & 0xfffff)) - 1));
    local_c8 = eqLit;
    if (*(int *)(::Lib::env + 0x8898) == 2) {
      local_118 = Kernel::Clause::getAnswerLiteral(local_180);
      pLVar15 = Kernel::Clause::getAnswerLiteral(pCVar19);
    }
    else {
      local_118 = (Literal *)0x0;
      pLVar15 = (Literal *)0x0;
    }
    if ((performSuperposition(Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::AbstractingUnifier*,bool)
         ::afterCheck == '\0') &&
       (iVar10 = __cxa_guard_acquire(&performSuperposition(Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::AbstractingUnifier*,bool)
                                      ::afterCheck), iVar10 != 0)) {
      iVar10 = (*(this->super_GeneratingInferenceEngine).super_SimplifyingGeneratingInference.
                 super_InferenceEngine._vptr_InferenceEngine[4])(this);
      if (*(char *)(CONCAT44(extraout_var_01,iVar10) + 0x1502) == '\x01') {
        iVar10 = (*((((this->super_GeneratingInferenceEngine).super_SimplifyingGeneratingInference.
                      super_InferenceEngine._salg)->_selector)._obj)->_vptr_LiteralSelector[2])();
        performSuperposition::afterCheck = SUB41(iVar10,0);
      }
      else {
        performSuperposition::afterCheck = false;
      }
      __cxa_guard_release(&performSuperposition(Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::AbstractingUnifier*,bool)
                           ::afterCheck);
      pCVar19 = local_188;
    }
    SVar5._M_t.
    super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
    .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
         res._self._M_t.
         super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
         .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl;
    if (*(long *)((long)res._self._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl
                 + 0x10) ==
        *(long *)((long)res._self._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl
                 + 0x18)) {
      ::Lib::Stack<Kernel::Literal_*>::expand
                ((Stack<Kernel::Literal_*> *)
                 res._self._M_t.
                 super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                 .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl);
    }
    **(undefined8 **)
      ((long)SVar5._M_t.
             super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
             .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl + 0x10) =
         pLVar14;
    plVar1 = (long *)((long)SVar5._M_t.
                            super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                            .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                            _M_head_impl + 0x10);
    *plVar1 = *plVar1 + 8;
    uVar8 = (pLVar14->super_Term)._weight;
    bVar6 = uVar23 != 0;
    if (bVar6) {
      local_168 = (ulong)((uint)local_168 & 0xfffff);
      lVar20 = 0x30;
      if (eqIsResult) {
        lVar20 = 0x18;
      }
      uVar23 = 0;
      pCVar21 = local_180;
      do {
        bVar4 = true;
        if ((pCVar21->_literals[uVar23] != rwLit) &&
           (pCVar21->_literals[uVar23] != local_118 ||
            (local_118 == (Literal *)0x0 || pLVar15 == (Literal *)0x0))) {
          pLVar14 = (Literal *)
                    (**(code **)((long)(subst._obj)->_vptr_ResultSubstitution + lVar20))();
          if (performSuperposition::doSimS == true) {
            pLVar14 = Kernel::EqHelper::replace(pLVar14,trm,TVar12);
          }
          if ((((pLVar14->super_Term)._functor != 0) ||
              (((pLVar14->super_Term)._args[0]._content & 4) == 0)) ||
             (uVar16 = (ulong)(*(uint *)&(pLVar14->super_Term).field_0xc & 0xfffffff),
             (pLVar14->super_Term)._args[uVar16]._content !=
             (pLVar14->super_Term)._args[uVar16 - 1]._content)) {
            if ((char)local_174 != '\0') {
              uVar8 = uVar8 + (pLVar14->super_Term)._weight;
              cVar7 = (**(code **)(*(long *)&(passiveClauseContainer->
                                             super_RandomAccessClauseContainer).
                                             super_ClauseContainer + 0x88))
                                (passiveClauseContainer,uVar8,numPositiveLiteralsLowerBound,&inf);
              if (cVar7 != '\0') {
                *(int *)(DAT_00b7e1c0 + 0x1e4) = *(int *)(DAT_00b7e1c0 + 0x1e4) + 1;
                bVar4 = false;
                pCVar21 = local_180;
                pCVar19 = local_188;
                goto LAB_00521619;
              }
            }
            if (((performSuperposition::afterCheck != true) ||
                ((*(uint *)&local_180->field_0x3c & 0xfffff) <= uVar23)) ||
               (iVar10 = (*this_00->_vptr_Ordering[2])(this_00,pLVar14,pLVar13), iVar10 != 1)) {
              SVar5._M_t.
              super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
              .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
                   res._self._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl;
              if (*(long *)((long)res._self._M_t.
                                  super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                  .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                  _M_head_impl + 0x10) ==
                  *(long *)((long)res._self._M_t.
                                  super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                  .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                  _M_head_impl + 0x18)) {
                ::Lib::Stack<Kernel::Literal_*>::expand
                          ((Stack<Kernel::Literal_*> *)
                           res._self._M_t.
                           super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                           .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                           _M_head_impl);
              }
              **(undefined8 **)
                ((long)SVar5._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                       .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl +
                0x10) = pLVar14;
              plVar1 = (long *)((long)SVar5._M_t.
                                      super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                      .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>
                                      ._M_head_impl + 0x10);
              *plVar1 = *plVar1 + 8;
              pCVar21 = local_180;
              pCVar19 = local_188;
              goto LAB_00521619;
            }
            *(int *)(DAT_00b7e1c0 + 0x1e8) = *(int *)(DAT_00b7e1c0 + 0x1e8) + 1;
          }
          bVar4 = false;
          pCVar21 = local_180;
          pCVar19 = local_188;
        }
LAB_00521619:
        if (!bVar4) break;
        uVar23 = uVar23 + 1;
        bVar6 = uVar23 < local_168;
      } while (uVar23 != local_168);
    }
    if (bVar6) {
LAB_0052189f:
      pCVar19 = (Clause *)0x0;
    }
    else {
      if (performSuperposition::afterCheck == true) {
        if ((*(uint *)&pCVar19->field_0x3b & 0xffffe00) == 0) {
          local_170._content = 0;
        }
        else {
          local_170._content =
               (uint64_t)Kernel::Literal::createEquality(true,arg1_00,TVar12,local_170);
        }
      }
      else {
        local_170._content = 0;
      }
      bVar6 = (uVar24 & 0xfffff) != 0;
      if (bVar6) {
        local_168 = 0x18;
        if (eqIsResult) {
          local_168 = 0x30;
        }
        uVar24 = 0;
        do {
          bVar4 = true;
          if (pCVar19->_literals[uVar24] != local_c8) {
            lVar20 = (**(code **)((long)(subst._obj)->_vptr_ResultSubstitution + local_168))();
            if (((*(int *)(lVar20 + 8) == 0) && ((*(byte *)(lVar20 + 0x28) & 4) != 0)) &&
               (uVar23 = (ulong)(*(uint *)(lVar20 + 0xc) & 0xfffffff),
               *(long *)(lVar20 + 0x28 + uVar23 * 8) == *(long *)(lVar20 + 0x20 + uVar23 * 8))) {
LAB_00521801:
              bVar4 = false;
              pCVar19 = local_188;
            }
            else {
              if ((char)local_174 != '\0') {
                uVar8 = uVar8 + *(int *)(lVar20 + 0x10);
                cVar7 = (**(code **)(*(long *)&(passiveClauseContainer->
                                               super_RandomAccessClauseContainer).
                                               super_ClauseContainer + 0x88))
                                  (passiveClauseContainer,uVar8,numPositiveLiteralsLowerBound,&inf);
                if (cVar7 != '\0') {
                  *(int *)(DAT_00b7e1c0 + 0x1e4) = *(int *)(DAT_00b7e1c0 + 0x1e4) + 1;
                  goto LAB_00521801;
                }
              }
              pCVar19 = local_188;
              if ((((Literal *)local_170._content == (Literal *)0x0) ||
                  ((*(uint *)&local_188->field_0x3c & 0xfffff) <= uVar24)) ||
                 (uVar9 = (*this_00->_vptr_Ordering[2])(this_00,lVar20,local_170._content),
                 (uVar9 & 0xfffffffd) != 1)) {
                SVar5._M_t.
                super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
                     res._self._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                     .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl;
                if (*(long *)((long)res._self._M_t.
                                    super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                    .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                    _M_head_impl + 0x10) ==
                    *(long *)((long)res._self._M_t.
                                    super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                    .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                    _M_head_impl + 0x18)) {
                  ::Lib::Stack<Kernel::Literal_*>::expand
                            ((Stack<Kernel::Literal_*> *)
                             res._self._M_t.
                             super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                             .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                             _M_head_impl);
                }
                **(long **)((long)SVar5._M_t.
                                  super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                  .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                  _M_head_impl + 0x10) = lVar20;
                plVar1 = (long *)((long)SVar5._M_t.
                                        super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                        .
                                        super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>
                                        ._M_head_impl + 0x10);
                *plVar1 = *plVar1 + 8;
                pCVar19 = local_188;
              }
              else {
                *(int *)(DAT_00b7e1c0 + 0x1e8) = *(int *)(DAT_00b7e1c0 + 0x1e8) + 1;
                bVar4 = false;
              }
            }
          }
          if (!bVar4) break;
          uVar24 = uVar24 + 1;
          bVar6 = uVar24 < (local_120 & 0xfffff);
        } while (uVar24 != (local_120 & 0xfffff));
      }
      SVar5._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
           res._self._M_t.
           super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
           .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl;
      if (bVar6) goto LAB_0052189f;
      Kernel::UnificationConstraintStack::literals
                ((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                  *)&arg1,(unifier->_constr)._self._M_t.
                          super___uniq_ptr_impl<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Kernel::UnificationConstraintStack_*,_std::default_delete<Kernel::UnificationConstraintStack>_>
                          .super__Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false>.
                          _M_head_impl,
                 (RobSubstitution *)
                 (unifier->_subs)._self._M_t.
                 super___uniq_ptr_impl<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Kernel::RobSubstitution_*,_std::default_delete<Kernel::RobSubstitution>_>
                 .super__Head_base<0UL,_Kernel::RobSubstitution_*,_false>);
      it._stack = (Stack<Kernel::Literal_*> *)arg1._content;
      it._pointer = *(Literal ***)(arg1._content + 0x10);
      ::Lib::Stack<Kernel::Literal*>::loadFromIterator<Lib::Stack<Kernel::Literal*>::RefIterator>
                ((Stack<Kernel::Literal*> *)
                 SVar5._M_t.
                 super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                 .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,it);
      pLVar13 = local_c8;
      ::Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      ~Recycled((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 *)&arg1);
      if (local_118 != (Literal *)0x0 && pLVar15 != (Literal *)0x0) {
        lVar22 = 0x18;
        lVar20 = 0x30;
        if (eqIsResult) {
          lVar20 = 0x18;
        }
        local_168 = (**(code **)((long)(subst._obj)->_vptr_ResultSubstitution + lVar20))
                              (subst._obj,local_118);
        if (eqIsResult) {
          lVar22 = 0x30;
        }
        local_170._content =
             (**(code **)((long)(subst._obj)->_vptr_ResultSubstitution + lVar22))
                       (subst._obj,pLVar15);
        lVar20 = 0x18;
        if (eqIsResult) {
          lVar20 = 0x30;
        }
        uVar17 = (**(code **)((long)(subst._obj)->_vptr_ResultSubstitution + lVar20))
                           (subst._obj,pLVar13);
        SVar5 = res._self;
        pAVar18 = Shell::AnswerLiteralManager::getInstance();
        iVar10 = (*pAVar18->_vptr_AnswerLiteralManager[5])
                           (pAVar18,uVar17,local_168,local_170._content);
        if (*(long *)((long)SVar5._M_t.
                            super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                            .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                            _M_head_impl + 0x10) ==
            *(long *)((long)SVar5._M_t.
                            super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                            .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                            _M_head_impl + 0x18)) {
          ::Lib::Stack<Kernel::Literal_*>::expand
                    ((Stack<Kernel::Literal_*> *)
                     SVar5._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                     .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl);
        }
        **(undefined8 **)
          ((long)SVar5._M_t.
                 super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                 .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl + 0x10)
             = CONCAT44(extraout_var,iVar10);
        *(long *)((long)SVar5._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl
                 + 0x10) =
             *(long *)((long)SVar5._M_t.
                             super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                             .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                             _M_head_impl + 0x10) + 8;
        pCVar19 = local_188;
      }
      pCVar21 = local_180;
      if (((char)local_174 != '\0') &&
         (cVar7 = (**(code **)(*(long *)&(passiveClauseContainer->super_RandomAccessClauseContainer)
                                         .super_ClauseContainer + 0x88))
                            (passiveClauseContainer,uVar8,numPositiveLiteralsLowerBound,&inf),
         cVar7 != '\0')) {
        *(int *)(DAT_00b7e1c0 + 0x1e4) = *(int *)(DAT_00b7e1c0 + 0x1e4) + 1;
        goto LAB_0052189f;
      }
      if ((unifier->_uwa)._mode == OFF) {
        if (pCVar21 == pCVar19) {
          *(int *)(DAT_00b7e1c0 + 0x4c) = *(int *)(DAT_00b7e1c0 + 0x4c) + 1;
        }
        else if (eqIsResult) {
          *(int *)(DAT_00b7e1c0 + 0x44) = *(int *)(DAT_00b7e1c0 + 0x44) + 1;
        }
        else {
          *(int *)(DAT_00b7e1c0 + 0x48) = *(int *)(DAT_00b7e1c0 + 0x48) + 1;
        }
      }
      else if (pCVar21 == pCVar19) {
        *(int *)(DAT_00b7e1c0 + 0x50) = *(int *)(DAT_00b7e1c0 + 0x50) + 1;
      }
      else if (eqIsResult) {
        *(int *)(DAT_00b7e1c0 + 0x54) = *(int *)(DAT_00b7e1c0 + 0x54) + 1;
      }
      else {
        *(int *)(DAT_00b7e1c0 + 0x58) = *(int *)(DAT_00b7e1c0 + 0x58) + 1;
      }
      inf_destroyer._destroyee = (Inference *)0x0;
      local_68._0_8_ = inf._0_8_;
      local_68._8_4_ = inf._8_4_;
      local_68._age = inf._age;
      local_68._splits = inf._splits;
      local_68._ptr1 = inf._ptr1;
      local_68._ptr2 = inf._ptr2;
      local_68.th_ancestors = inf.th_ancestors;
      local_68.all_ancestors = inf.all_ancestors;
      pCVar19 = Kernel::Clause::fromStack
                          ((Stack<Kernel::Literal_*> *)
                           res._self._M_t.
                           super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                           .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                           _M_head_impl,&local_68);
      if (*(int *)(::Lib::env + 0x85a8) == 2) {
        extra = (InferenceExtra *)::operator_new(0x40);
        extra->_vptr_InferenceExtra = (_func_int **)&PTR__TwoLiteralRewriteInferenceExtra_00b665c0;
        extra[1]._vptr_InferenceExtra = (_func_int **)&PTR__TwoLiteralInferenceExtra_00b66540;
        extra[2]._vptr_InferenceExtra = (_func_int **)&PTR__InferenceExtra_00b66500;
        extra[3]._vptr_InferenceExtra = (_func_int **)rwLit;
        extra[4]._vptr_InferenceExtra = (_func_int **)pLVar13;
        extra[5]._vptr_InferenceExtra = (_func_int **)&PTR__InferenceExtra_00b66580;
        extra[6]._vptr_InferenceExtra = (_func_int **)eqLHS._content;
        extra[7]._vptr_InferenceExtra = (_func_int **)rwTerm._content;
        ::Lib::ProofExtra::insert((ProofExtra *)&DAT_00b7e1d8,&pCVar19->super_Unit,extra);
      }
    }
    ::Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
    ~Recycled(&res);
  }
  else {
    if (andThatsIt != true) {
      if ((char)local_174 != '\0') {
        local_d8._obj = subst._obj;
        local_d8._refCnt = subst._refCnt;
        if (subst._refCnt != (RefCounter *)0x0 && subst._obj != (ResultSubstitution *)0x0) {
          (subst._refCnt)->_val = (subst._refCnt)->_val + 1;
        }
        bVar6 = earlyWeightLimitCheck
                          (local_188,eqLit,local_180,rwLit,rwTerm,eqLHS,TVar12,&local_d8,eqIsResult,
                           passiveClauseContainer,numPositiveLiteralsLowerBound,&inf);
        if (((local_d8._obj != (ResultSubstitution *)0x0) && (local_d8._refCnt != (RefCounter *)0x0)
            ) && (((local_d8._refCnt)->_val = (local_d8._refCnt)->_val + -1,
                  (local_d8._refCnt)->_val == 0 &&
                  ((*(local_d8._obj)->_vptr_ResultSubstitution[1])(),
                  local_d8._refCnt != (RefCounter *)0x0)))) {
          *(undefined8 *)local_d8._refCnt = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_d8._refCnt;
        }
        if (!bVar6) goto LAB_00521279;
      }
      goto LAB_00521180;
    }
    *(int *)(DAT_00b7e1c0 + 0x1e4) = *(int *)(DAT_00b7e1c0 + 0x1e4) + 1;
LAB_00521279:
    pCVar19 = (Clause *)0x0;
  }
  Kernel::Inference::Destroyer::~Destroyer(&inf_destroyer);
LAB_005218bb:
  if (((subst._obj != (ResultSubstitution *)0x0) && (subst._refCnt != (RefCounter *)0x0)) &&
     (((subst._refCnt)->_val = (subst._refCnt)->_val + -1, (subst._refCnt)->_val == 0 &&
      ((*(subst._obj)->_vptr_ResultSubstitution[1])(), subst._refCnt != (RefCounter *)0x0)))) {
    *(undefined8 *)subst._refCnt = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
    ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = subst._refCnt;
  }
  return pCVar19;
}

Assistant:

Clause* Superposition::performSuperposition(
    Clause* rwClause, Literal* rwLit, TermList rwTerm,
    Clause* eqClause, Literal* eqLit, TermList eqLHS,
    AbstractingUnifier* unifier, bool eqIsResult)
{
  TIME_TRACE("perform superposition");
  // we want the rwClause and eqClause to be active
  ASS(rwClause->store()==Clause::ACTIVE);
  ASS(eqClause->store()==Clause::ACTIVE);

  // the first checks the reference and the second checks the stack
  auto subst = ResultSubstitution::fromSubstitution(&unifier->subs(), RetrievalAlgorithms::DefaultVarBanks::query, RetrievalAlgorithms::DefaultVarBanks::internal);
  TermList eqLHSsort = SortHelper::getEqualityArgumentSort(eqLit);

  if(eqLHS.isVar()) {
    if(!checkSuperpositionFromVariable(eqClause, eqLit, eqLHS)) {
      return 0;
    }
  }

  if(!checkClauseColorCompatibility(eqClause, rwClause)) {
    return 0;
  }

  unsigned rwLength = rwClause->length();
  unsigned eqLength = eqClause->length();

  TermList tgtTerm = EqHelper::getOtherEqualitySide(eqLit, eqLHS);

  // LRS-specific optimization:
  // check whether we can conclude that the resulting clause will be discarded by LRS since it does not fulfil the age/weight limits (in which case we can discard the clause)
  // we already know the age here so we can immediately conclude whether the clause fulfils the age limit
  // since we have not built the clause yet we compute lower bounds on the weight of the clause after each step and recheck whether the weight-limit can still be fulfilled.

  unsigned numPositiveLiteralsLowerBound = Int::max(eqClause->numPositiveLiterals()-1, rwClause->numPositiveLiterals()); // lower bound on number of positive literals, don't know at this point whether duplicate positive literals will occur
  //TODO update inference rule name AYB
  Inference inf(GeneratingInference2(unifier->usesUwa() ? InferenceRule::CONSTRAINED_SUPERPOSITION : InferenceRule::SUPERPOSITION, rwClause, eqClause));
  Inference::Destroyer inf_destroyer(inf);

  auto passiveClauseContainer = _salg->getPassiveClauseContainer();
  bool andThatsIt = false;
  bool hasAgeLimitStrike = passiveClauseContainer && passiveClauseContainer->mayBeAbleToDiscriminateClausesUnderConstructionOnLimits()
                        && passiveClauseContainer->exceedsAgeLimit(numPositiveLiteralsLowerBound, inf, andThatsIt);

  if(hasAgeLimitStrike && andThatsIt) { // we are dealing with purely age-limited container (no need for weight-related investigations)
    env.statistics->discardedNonRedundantClauses++;
    RSTAT_CTR_INC("superpositions skipped for (pure) age limit before building clause");
    return 0;
  }

  if(hasAgeLimitStrike) {
    if(!earlyWeightLimitCheck(eqClause, eqLit, rwClause, rwLit, rwTerm, eqLHS, tgtTerm, subst, eqIsResult, passiveClauseContainer, numPositiveLiteralsLowerBound, inf)) {
      return 0;
    }
  }

  const auto& parRedHandler = _salg->parRedHandler();
  if (!unifier->usesUwa()) {
    if (!parRedHandler.checkSuperposition(eqClause, eqLit, rwClause, rwLit, eqIsResult, subst.ptr())) {
      return 0;
    }
  }

  const Ordering& ordering = _salg->getOrdering();

  TermList tgtTermS = subst->apply(tgtTerm, eqIsResult);

  Literal* rwLitS = subst->apply(rwLit, !eqIsResult);
  TermList rwTermS = subst->apply(rwTerm, !eqIsResult);

  //cout << "Check ordering on " << tgtTermS.toString() << " and " << rwTermS.toString() << endl;

  //check that we're not rewriting smaller subterm with larger
  auto comp = ordering.compare(tgtTermS,rwTermS);
  if(Ordering::isGreaterOrEqual(comp)) {
    return 0;
  }

  if(rwLitS->isEquality()) {
    //check that we're not rewriting only the smaller side of an equality
    TermList arg0=*rwLitS->nthArgument(0);
    TermList arg1=*rwLitS->nthArgument(1);

    if(!arg0.containsSubterm(rwTermS)) {
      if(Ordering::isGreaterOrEqual(ordering.getEqualityArgumentOrder(rwLitS))) {
        return 0;
      }
    } else if(!arg1.containsSubterm(rwTermS)) {
      if(Ordering::isGreaterOrEqual(Ordering::reverse(ordering.getEqualityArgumentOrder(rwLitS)))) {
        return 0;
      }
    }
  }

  if (!unifier->usesUwa()) {
    parRedHandler.insertSuperposition(
      eqClause, rwClause, rwTermS, tgtTermS, eqLHS, rwLitS, eqLit, comp, eqIsResult, subst.ptr());
  }

  Literal* tgtLitS = EqHelper::replace(rwLitS,rwTermS,tgtTermS);

  static bool doSimS = getOptions().simulatenousSuperposition();

  //check we don't create an equational tautology (this happens during self-superposition)
  if(EqHelper::isEqTautology(tgtLitS)) {
    return 0;
  }

  TermList eqLHSS = subst->apply(eqLHS, eqIsResult);

#if VDEBUG
  if(!unifier->usesUwa()){
    ASS_EQ(rwTermS,eqLHSS);
  }
#endif

  Recycled<Stack<Literal*>> res;
  res->reserve(rwLength + eqLength - 1 + unifier->maxNumberOfConstraints());

  bool synthesis = (env.options->questionAnswering() == Options::QuestionAnsweringMode::SYNTHESIS);
  Literal* rwAnsLit = synthesis ? rwClause->getAnswerLiteral() : nullptr;
  Literal* eqAnsLit = synthesis ? eqClause->getAnswerLiteral() : nullptr;
  bool bothHaveAnsLit = (rwAnsLit != nullptr) && (eqAnsLit != nullptr);

  static bool afterCheck = getOptions().literalMaximalityAftercheck() && _salg->getLiteralSelector().isBGComplete();

  res->push(tgtLitS);
  unsigned weight=tgtLitS->weight();
  for(unsigned i=0;i<rwLength;i++) {
    Literal* curr=(*rwClause)[i];
    if(curr!=rwLit && (!bothHaveAnsLit || curr!=rwAnsLit)) {
      Literal* currAfter = subst->apply(curr, !eqIsResult);

      if (doSimS) {
        currAfter = EqHelper::replace(currAfter,rwTermS,tgtTermS);
      }

      if(EqHelper::isEqTautology(currAfter)) {
        return nullptr;
      }

      if(hasAgeLimitStrike) {
        weight+=currAfter->weight();
        if(passiveClauseContainer->exceedsWeightLimit(weight, numPositiveLiteralsLowerBound, inf)) {
          RSTAT_CTR_INC("superpositions skipped for weight limit while constructing other literals");
          env.statistics->discardedNonRedundantClauses++;
          return nullptr;
        }
      }

      if (afterCheck) {
        TIME_TRACE(TimeTrace::LITERAL_ORDER_AFTERCHECK)
        if (i < rwClause->numSelected() && ordering.compare(currAfter,rwLitS) == Ordering::GREATER) {
          env.statistics->inferencesBlockedForOrderingAftercheck++;
          return nullptr;
        }
      }

      res->push(currAfter);
    }
  }

  {
    Literal* eqLitS = 0;
    if (afterCheck && eqClause->numSelected() > 1) {
      TIME_TRACE(TimeTrace::LITERAL_ORDER_AFTERCHECK);
      eqLitS = Literal::createEquality(true,eqLHSS,tgtTermS,eqLHSsort);
    }

    for(unsigned i=0;i<eqLength;i++) {
      Literal* curr=(*eqClause)[i];
      if(curr!=eqLit) {
        Literal* currAfter = subst->apply(curr, eqIsResult);

        if(EqHelper::isEqTautology(currAfter)) {
          return nullptr;
        }
        if(hasAgeLimitStrike) {
          weight+=currAfter->weight();
          if(passiveClauseContainer->exceedsWeightLimit(weight, numPositiveLiteralsLowerBound, inf)) {
            RSTAT_CTR_INC("superpositions skipped for weight limit while constructing other literals");
            env.statistics->discardedNonRedundantClauses++;
            return nullptr;
          }
        }

        if (eqLitS && i < eqClause->numSelected()) {
          TIME_TRACE(TimeTrace::LITERAL_ORDER_AFTERCHECK);

          Ordering::Result o = ordering.compare(currAfter,eqLitS);

          if (o == Ordering::GREATER || o == Ordering::EQUAL) {
            env.statistics->inferencesBlockedForOrderingAftercheck++;
            return nullptr;
          }
        }

        res->push(currAfter);
      }
    }
  }

  res->loadFromIterator(unifier->computeConstraintLiterals()->iter());

  if (bothHaveAnsLit) {
    Literal* newLitC = subst->apply(rwAnsLit, !eqIsResult);
    Literal* newLitD = subst->apply(eqAnsLit, eqIsResult);
    Literal* condLit = subst->apply(eqLit, eqIsResult);
    res->push(SynthesisALManager::getInstance()->makeITEAnswerLiteral(condLit, newLitC, newLitD));
  }

  if(hasAgeLimitStrike && passiveClauseContainer->exceedsWeightLimit(weight, numPositiveLiteralsLowerBound, inf)) {
    RSTAT_CTR_INC("superpositions skipped for weight limit after the clause was built");
    env.statistics->discardedNonRedundantClauses++;
    return nullptr;
  }

  if(!unifier->usesUwa()){
    if(rwClause==eqClause) {
      env.statistics->selfSuperposition++;
    } else if(eqIsResult) {
      env.statistics->forwardSuperposition++;
    } else {
      env.statistics->backwardSuperposition++;
    }
  } else {
    if(rwClause==eqClause) {
      env.statistics->cSelfSuperposition++;
    } else if(eqIsResult) {
      env.statistics->cForwardSuperposition++;
    } else {
      env.statistics->cBackwardSuperposition++;
    }
  }

  inf_destroyer.disable(); // ownership passed to the the clause below
  auto clause = Clause::fromStack(*res, inf);

  if(env.options->proofExtra() == Options::ProofExtra::FULL)
    env.proofExtra.insert(clause, new SuperpositionExtra(
      rwLit,
      eqLit,
      eqLHS,
      rwTerm
    ));

  return clause;
}